

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O1

QOpenGLFunctionsPrivateEx * qt_gl_functions(QOpenGLContext *context)

{
  QOpenGLFunctionsPrivateEx *pQVar1;
  
  if (context == (QOpenGLContext *)0x0) {
    context = QOpenGLContext::currentContext();
  }
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>>::
      instance()::holder == '\0') {
    qt_gl_functions();
  }
  pQVar1 = QOpenGLMultiGroupSharedResource::value<QOpenGLFunctionsPrivateEx>
                     ((QOpenGLMultiGroupSharedResource *)
                      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_gl_functions_resource>>
                      ::instance()::holder,context);
  return pQVar1;
}

Assistant:

static QOpenGLFunctionsPrivateEx *qt_gl_functions(QOpenGLContext *context = nullptr)
{
    if (!context)
        context = QOpenGLContext::currentContext();
    Q_ASSERT(context);
    QOpenGLFunctionsPrivateEx *funcs =
        qt_gl_functions_resource()->value<QOpenGLFunctionsPrivateEx>(context);
    return funcs;
}